

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O2

void __thiscall de::anon_unknown_0::TestExitThread::run(TestExitThread *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  bool bVar5;
  Random rnd;
  deRandom local_30;
  
  dVar1 = deInt32Hash(this->m_numThreads);
  dVar2 = deInt32Hash(this->m_threadNdx);
  dVar3 = deInt32Hash(this->m_waitMode);
  deRandom_init(&local_30,dVar1 ^ dVar2 ^ dVar3);
  iVar4 = 10000;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      return;
    }
    dVar1 = deRandom_getUint32(&local_30);
    if (dVar1 % 0x3e9 == 0) break;
    SpinBarrier::sync(this->m_barrier);
  }
  SpinBarrier::removeThread(this->m_barrier,this->m_waitMode);
  return;
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx) ^ deInt32Hash((deInt32)m_waitMode));
		const int	invExitProb	= 1000;

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			if (rnd.getInt(0, invExitProb) == 0)
			{
				m_barrier.removeThread(m_waitMode);
				break;
			}
			else
				m_barrier.sync(m_waitMode);
		}
	}